

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O3

void __thiscall
gl3cts::SparseBuffersWithCopyOpsTest::SparseBuffersWithCopyOpsTest
          (SparseBuffersWithCopyOpsTest *this,Context *context)

{
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,"CommonBug_SparseBuffersWithCopyOps",
             "Verifies sparse buffer functionality works correctly when CPU->GPU and GPU->GPU memory transfers are involved."
            );
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_020ef918;
  this->m_bo_id = 0;
  this->m_bo_read_id = 0;
  this->m_clear_buffer = (uchar *)0x0;
  this->m_page_size = 0;
  this->m_result_data_storage_size = 0;
  this->m_n_iterations_to_run = 0x10;
  this->m_n_pages_to_test = 0x10;
  this->m_virtual_bo_size = 0x1f460000;
  this->m_reference_data[0] = '\0';
  this->m_reference_data[1] = '\x01';
  this->m_reference_data[2] = '\x02';
  this->m_reference_data[3] = '\x03';
  this->m_reference_data[4] = '\x04';
  this->m_reference_data[5] = '\x05';
  this->m_reference_data[6] = '\x06';
  this->m_reference_data[7] = '\a';
  this->m_reference_data[8] = '\b';
  this->m_reference_data[9] = '\t';
  this->m_reference_data[10] = '\n';
  this->m_reference_data[0xb] = '\v';
  this->m_reference_data[0xc] = '\f';
  this->m_reference_data[0xd] = '\r';
  this->m_reference_data[0xe] = '\x0e';
  this->m_reference_data[0xf] = '\x0f';
  return;
}

Assistant:

SparseBuffersWithCopyOpsTest::SparseBuffersWithCopyOpsTest(deqp::Context& context)
	: TestCase(context, "CommonBug_SparseBuffersWithCopyOps",
			   "Verifies sparse buffer functionality works correctly when CPU->GPU and GPU->GPU"
			   " memory transfers are involved.")
	, m_bo_id(0)
	, m_bo_read_id(0)
	, m_clear_buffer(DE_NULL)
	, m_page_size(0)
	, m_result_data_storage_size(0)
	, m_n_iterations_to_run(16)
	, m_n_pages_to_test(16)
	, m_virtual_bo_size(512 /* MB */ * 1024768)
{
	for (unsigned int n = 0; n < sizeof(m_reference_data) / sizeof(m_reference_data[0]); ++n)
	{
		m_reference_data[n] = static_cast<unsigned char>(n);
	}
}